

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::SSLClient::verify_host_with_subject_alt_name(SSLClient *this,X509 *server_cert)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  stack_st_GENERAL_NAME *sk;
  OPENSSL_STACK *pOVar5;
  int *piVar6;
  size_t sVar7;
  X509 *in_RSI;
  size_t name_len;
  char *name;
  GENERAL_NAME *val;
  size_t in_stack_00000028;
  int i;
  int count;
  bool ip_mached;
  bool dsn_matched;
  stack_st_GENERAL_NAME *alt_names;
  size_t addr_len;
  in_addr addr;
  in6_addr addr6;
  int type;
  bool ret;
  byte local_71;
  int local_4c;
  bool local_41;
  size_t local_38;
  undefined1 local_2c [4];
  undefined1 local_28 [16];
  int local_18;
  byte local_11;
  X509 *local_10;
  
  local_11 = 0;
  local_18 = 2;
  local_38 = 0;
  local_10 = in_RSI;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = inet_pton(10,pcVar4,local_28);
  if (iVar2 == 0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iVar2 = inet_pton(2,pcVar4,local_2c);
    if (iVar2 != 0) {
      local_18 = 7;
      local_38 = 4;
    }
  }
  else {
    local_18 = 7;
    local_38 = 0x10;
  }
  sk = (stack_st_GENERAL_NAME *)X509_get_ext_d2i(local_10,0x55,(int *)0x0,(int *)0x0);
  if (sk != (stack_st_GENERAL_NAME *)0x0) {
    local_41 = false;
    bVar1 = false;
    pOVar5 = ossl_check_const_GENERAL_NAME_sk_type(sk);
    iVar2 = OPENSSL_sk_num(pOVar5);
    local_4c = 0;
    while( true ) {
      local_71 = 0;
      if (local_4c < iVar2) {
        local_71 = local_41 ^ 0xff;
      }
      if ((local_71 & 1) == 0) break;
      pOVar5 = ossl_check_const_GENERAL_NAME_sk_type(sk);
      piVar6 = (int *)OPENSSL_sk_value(pOVar5,local_4c);
      if (*piVar6 == local_18) {
        pcVar4 = (char *)ASN1_STRING_get0_data(*(undefined8 *)(piVar6 + 2));
        iVar3 = ASN1_STRING_length(*(ASN1_STRING **)(piVar6 + 2));
        sVar7 = strlen(pcVar4);
        if (sVar7 == (long)iVar3) {
          if (local_18 == 2) {
            local_41 = check_host_name((SSLClient *)alt_names,_count,in_stack_00000028);
          }
          else if ((local_18 == 7) &&
                  ((iVar3 = memcmp(local_28,pcVar4,local_38), iVar3 == 0 ||
                   (iVar3 = memcmp(local_2c,pcVar4,local_38), iVar3 == 0)))) {
            bVar1 = true;
          }
        }
      }
      local_4c = local_4c + 1;
    }
    if ((local_41 != false) || (bVar1)) {
      local_11 = 1;
    }
  }
  GENERAL_NAMES_free((GENERAL_NAMES *)sk);
  return (bool)(local_11 & 1);
}

Assistant:

inline bool
SSLClient::verify_host_with_subject_alt_name(X509 *server_cert) const {
  auto ret = false;

  auto type = GEN_DNS;

  struct in6_addr addr6;
  struct in_addr addr;
  size_t addr_len = 0;

#ifndef __MINGW32__
  if (inet_pton(AF_INET6, host_.c_str(), &addr6)) {
    type = GEN_IPADD;
    addr_len = sizeof(struct in6_addr);
  } else if (inet_pton(AF_INET, host_.c_str(), &addr)) {
    type = GEN_IPADD;
    addr_len = sizeof(struct in_addr);
  }
#endif

  auto alt_names = static_cast<const struct stack_st_GENERAL_NAME *>(
      X509_get_ext_d2i(server_cert, NID_subject_alt_name, nullptr, nullptr));

  if (alt_names) {
    auto dsn_matched = false;
    auto ip_mached = false;

    auto count = sk_GENERAL_NAME_num(alt_names);

    for (auto i = 0; i < count && !dsn_matched; i++) {
      auto val = sk_GENERAL_NAME_value(alt_names, i);
      if (val->type == type) {
        auto name = (const char *)ASN1_STRING_get0_data(val->d.ia5);
        auto name_len = (size_t)ASN1_STRING_length(val->d.ia5);

        if (strlen(name) == name_len) {
          switch (type) {
          case GEN_DNS: dsn_matched = check_host_name(name, name_len); break;

          case GEN_IPADD:
            if (!memcmp(&addr6, name, addr_len) ||
                !memcmp(&addr, name, addr_len)) {
              ip_mached = true;
            }
            break;
          }
        }
      }
    }

    if (dsn_matched || ip_mached) { ret = true; }
  }

  GENERAL_NAMES_free((STACK_OF(GENERAL_NAME) *)alt_names);

  return ret;
}